

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall embree::XMLWriter::store_array_elt(XMLWriter *this,Vec3fa *v)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>((double)(v->field_0).m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(v->field_0).m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(v->field_0).m128[2]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store_array_elt(const Vec3fa& v) {
    xml << v.x << " " << v.y << " " << v.z << std::endl;
  }